

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void icetGetFloatv(IceTEnum pname,IceTFloat *params)

{
  ulong uVar1;
  IceTEnum type;
  IceTState pIVar2;
  ulong uVar3;
  ulong uVar4;
  char msg [256];
  
  uVar1 = (ulong)pname;
  pIVar2 = icetGetState();
  switch(pIVar2[uVar1].type) {
  case 0x8000:
    uVar4 = 0;
    uVar3 = (ulong)(uint)pIVar2[uVar1].num_entries;
    if (pIVar2[uVar1].num_entries < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      params[uVar4] = (IceTFloat)(float)*(byte *)((long)pIVar2[uVar1].data + uVar4);
    }
    break;
  case 0x8001:
  case 0x8002:
switchD_00109d05_caseD_8001:
    sprintf(msg,"Could not cast value for 0x%x.",uVar1);
    type = 0xfffffffd;
    goto LAB_00109d70;
  case 0x8003:
    uVar4 = 0;
    uVar3 = (ulong)(uint)pIVar2[uVar1].num_entries;
    if (pIVar2[uVar1].num_entries < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      params[uVar4] = (IceTFloat)(float)*(int *)((long)pIVar2[uVar1].data + uVar4 * 4);
    }
    break;
  case 0x8004:
    uVar4 = 0;
    uVar3 = (ulong)(uint)pIVar2[uVar1].num_entries;
    if (pIVar2[uVar1].num_entries < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      params[uVar4] = *(IceTFloat *)((long)pIVar2[uVar1].data + uVar4 * 4);
    }
    break;
  case 0x8005:
    uVar4 = 0;
    uVar3 = (ulong)(uint)pIVar2[uVar1].num_entries;
    if (pIVar2[uVar1].num_entries < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      params[uVar4] = (IceTFloat)(float)*(double *)((long)pIVar2[uVar1].data + uVar4 * 8);
    }
    break;
  default:
    if (pIVar2[uVar1].type != 0) goto switchD_00109d05_caseD_8001;
    sprintf(msg,"No such parameter, 0x%x.",uVar1);
    type = 0xfffffffe;
LAB_00109d70:
    icetRaiseDiagnostic(msg,type,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x150);
  }
  return;
}

Assistant:

void icetGetFloatv(IceTEnum pname, IceTFloat *params)
{
    struct IceTStateValue *value = icetGetState() + pname;
    int i;
    stateCheck(pname, icetGetState());
    copyArray(IceTFloat, params, value->type, value->data, value->num_entries);
}